

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O2

string * __thiscall
VcdGen::encode_signal_name_abi_cxx11_(string *__return_storage_ptr__,VcdGen *this,uint32_t index)

{
  ulong uVar1;
  initializer_list<char> __l;
  char local_4a [10];
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> symbols_;
  
  uVar1 = (ulong)this & 0xffffffff;
  builtin_strncpy(local_4a,"!@#$%^&*()",10);
  __l._M_len = 10;
  __l._M_array = local_4a;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,__l,
             (allocator_type *)
             ((long)&symbols_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)this == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,*(char *)local_40);
  }
  else {
    for (; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string encode_signal_name(uint32_t index){
    vector<char> symbols_ = {'!', '@', '#', '$', '%', '^', '&', '*', '(', ')'};
    string ret_val;
    if( index == 0 ){
        ret_val = symbols_[0];
    } else {
        while( index > 0 ){
            int digit = index % 10;
            ret_val += symbols_[digit];
            index /= 10;
        }
    }
    return ret_val;
}